

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLog.cpp
# Opt level: O2

ssize_t __thiscall SocketLog::send(SocketLog *this,int __fd,void *__buf,size_t __n,int __flags)

{
  TCPStream *this_00;
  bool bVar1;
  int iVar2;
  ssize_t sVar3;
  iterator __position;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  
  __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT44(in_register_00000034,__fd);
  std::mutex::lock(&this->streamMutex);
  if ((this->sendInterceptor).super__Function_base._M_manager != (_Manager_type)0x0) {
    bVar1 = std::
            function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::operator()(&this->sendInterceptor,__args);
    if (bVar1) goto LAB_00104ad7;
  }
  if (this->inited == true) {
    __position._M_current =
         (this->connectedStreams).super__Vector_base<TCPStream_*,_std::allocator<TCPStream_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
    while (__position._M_current !=
           (this->connectedStreams).super__Vector_base<TCPStream_*,_std::allocator<TCPStream_*>_>.
           _M_impl.super__Vector_impl_data._M_finish) {
      sVar3 = TCPStream::send(*__position._M_current,(int)(__args->_M_dataplus)._M_p,
                              (void *)__args->_M_string_length,__n,__flags);
      if (sVar3 == -1) {
        printf("send failed! delete(close) stream");
        putchar(10);
        this_00 = *__position._M_current;
        if (this_00 != (TCPStream *)0x0) {
          TCPStream::~TCPStream(this_00);
        }
        operator_delete(this_00);
        __position = std::vector<TCPStream_*,_std::allocator<TCPStream_*>_>::erase
                               (&this->connectedStreams,__position._M_current);
      }
      else {
        __position._M_current = __position._M_current + 1;
      }
    }
  }
LAB_00104ad7:
  iVar2 = pthread_mutex_unlock((pthread_mutex_t *)&this->streamMutex);
  return CONCAT44(extraout_var,iVar2);
}

Assistant:

void SocketLog::send(const std::string& msg) {
    std::lock_guard<std::mutex> lockStream(streamMutex);
    LOGD("SocketLog::send: %s", msg.c_str());

    if (sendInterceptor) {
        if (sendInterceptor(msg)) return;
    }

    if (!inited)
        return;

    auto size = connectedStreams.size();
    if (size == 0) {
        LOGD("no stream connected now! will not send!");
    } else {
        LOGD("stream connected num=%ld", size);
    }

    for(auto iter = connectedStreams.cbegin(); iter != connectedStreams.cend();) {
        auto& stream = *iter;

        LOGD("try to send to stream:%p", stream);
        auto ret = stream->send(msg.data(), msg.length());
        if (ret == -1) {
            LOGE("send failed! delete(close) stream");
            delete stream;
            iter = connectedStreams.erase(iter);
        } else {
            LOGD("send success!");
            iter++;
        }
    }
}